

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

QLayoutItem * __thiscall
QToolBarAreaLayout::unplug(QToolBarAreaLayout *this,QList<int> *path,QToolBarAreaLayout *other)

{
  int iVar1;
  int iVar2;
  Orientation OVar3;
  int *piVar4;
  long *plVar5;
  QToolBarAreaLayoutItem *pQVar6;
  Representation RVar7;
  char cVar8;
  QToolBarAreaLayoutItem *this_00;
  pointer pQVar9;
  QSize QVar10;
  pointer pQVar11;
  qsizetype qVar12;
  QSize QVar13;
  long lVar14;
  QToolBarAreaLayoutItem *pQVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int local_5c;
  
  this_00 = item(this,path);
  piVar4 = (path->d).ptr;
  iVar1 = piVar4[1];
  pQVar9 = QList<QToolBarAreaLayoutLine>::data(&this->docks[*piVar4].lines);
  iVar2 = this_00->size;
  OVar3 = pQVar9[iVar1].o;
  QVar10 = QToolBarAreaLayoutItem::realSizeHint(this_00);
  RVar7 = QVar10.ht.m_i;
  if (OVar3 == Horizontal) {
    RVar7 = QVar10.wd.m_i;
  }
  if (iVar2 == RVar7.m_i) goto LAB_004b24d0;
  lVar16 = (long)(path->d).ptr[2];
  local_5c = 0;
  if (0 < lVar16) {
    uVar17 = lVar16 + 1;
    lVar16 = lVar16 * 0x18;
    do {
      pQVar11 = QList<QToolBarAreaLayoutItem>::data(&pQVar9[iVar1].toolBarItems);
      if (((&pQVar11[-1].gap)[lVar16] != false) ||
         ((plVar5 = *(long **)((long)&pQVar11[-1].widgetItem + lVar16), plVar5 != (long *)0x0 &&
          (cVar8 = (**(code **)(*plVar5 + 0x40))(), cVar8 == '\0')))) {
        lVar14 = (long)(path->d).ptr[2];
        lVar18 = lVar14 + 1;
        qVar12 = pQVar9[iVar1].toolBarItems.d.size;
        if (lVar18 < qVar12) {
          pQVar15 = (QToolBarAreaLayoutItem *)((long)&pQVar11[-1].widgetItem + lVar16);
          lVar14 = lVar14 * 0x18 + 0x2c;
          goto LAB_004b237b;
        }
        break;
      }
      uVar17 = uVar17 - 1;
      lVar16 = lVar16 + -0x18;
    } while (1 < uVar17);
  }
  goto LAB_004b2412;
  while( true ) {
    plVar5 = *(long **)((long)pQVar6 + lVar14 + -0x14);
    if (plVar5 != (long *)0x0) {
      cVar8 = (**(code **)(*plVar5 + 0x40))();
      if (cVar8 == '\0') goto LAB_004b23b5;
      qVar12 = pQVar9[iVar1].toolBarItems.d.size;
    }
    lVar18 = lVar18 + 1;
    lVar14 = lVar14 + 0x18;
    if (qVar12 <= lVar18) break;
LAB_004b237b:
    pQVar6 = pQVar9[iVar1].toolBarItems.d.ptr;
    if (*(char *)((long)&pQVar6->widgetItem + lVar14) != '\0') {
LAB_004b23b5:
      local_5c = *(int *)((long)pQVar6 + lVar14 + -0xc);
      iVar2 = *(int *)((long)&pQVar11[-1].pos + lVar16);
      OVar3 = pQVar9[iVar1].o;
      QVar10 = QToolBarAreaLayoutItem::sizeHint(pQVar15);
      RVar7 = QVar10.ht.m_i;
      if (OVar3 == Horizontal) {
        RVar7 = QVar10.wd.m_i;
      }
      local_5c = local_5c - (RVar7.m_i + iVar2);
      QToolBarAreaLayoutItem::resize
                (pQVar15,pQVar9[iVar1].o,
                 *(int *)((long)pQVar6 + lVar14 + -0xc) - *(int *)((long)&pQVar11[-1].pos + lVar16))
      ;
      break;
    }
  }
LAB_004b2412:
  if (other != (QToolBarAreaLayout *)0x0) {
    piVar4 = (path->d).ptr;
    iVar1 = piVar4[1];
    pQVar9 = QList<QToolBarAreaLayoutLine>::data(&other->docks[*piVar4].lines);
    lVar16 = (long)(path->d).ptr[2];
    if (0 < lVar16) {
      uVar17 = lVar16 + 1;
      lVar16 = lVar16 * 0x18;
      do {
        pQVar11 = QList<QToolBarAreaLayoutItem>::data(&pQVar9[iVar1].toolBarItems);
        if (((&pQVar11[-1].gap)[lVar16] != false) ||
           ((plVar5 = *(long **)((long)&pQVar11[-1].widgetItem + lVar16), plVar5 != (long *)0x0 &&
            (cVar8 = (**(code **)(*plVar5 + 0x40))(), cVar8 == '\0')))) {
          OVar3 = pQVar9[iVar1].o;
          pQVar15 = (QToolBarAreaLayoutItem *)((long)&pQVar11[-1].widgetItem + lVar16);
          QVar13 = QToolBarAreaLayoutItem::sizeHint(pQVar15);
          QVar10 = (QSize)((ulong)QVar13 >> 0x20);
          if (OVar3 == Horizontal) {
            QVar10 = QVar13;
          }
          QToolBarAreaLayoutItem::resize(pQVar15,OVar3,local_5c + QVar10.wd.m_i.m_i);
          break;
        }
        uVar17 = uVar17 - 1;
        lVar16 = lVar16 + -0x18;
      } while (1 < uVar17);
    }
  }
LAB_004b24d0:
  this_00->gap = true;
  return this_00->widgetItem;
}

Assistant:

QLayoutItem *QToolBarAreaLayout::unplug(const QList<int> &path, QToolBarAreaLayout *other)
{
    //other needs to be update as well
    Q_ASSERT(path.size() == 3);
    QToolBarAreaLayoutItem *item = this->item(path);
    Q_ASSERT(item);

    //update the leading space here
    QToolBarAreaLayoutInfo &info = docks[path.at(0)];
    QToolBarAreaLayoutLine &line = info.lines[path.at(1)];
    if (item->size != pick(line.o, item->realSizeHint())) {
        //the item doesn't have its default size
        //so we'll give this to the next item
        int newExtraSpace = 0;
        //let's iterate over the siblings of the current item that pare placed before it
        //we need to find just the one before
        for (int i = path.at(2) - 1; i >= 0; --i) {
            QToolBarAreaLayoutItem &previous = line.toolBarItems[i];
            if (!previous.skip()) {
                //we need to check if it has a previous element and a next one
                //the previous will get its size changed
                for (int j = path.at(2) + 1; j < line.toolBarItems.size(); ++j) {
                    const QToolBarAreaLayoutItem &next = line.toolBarItems.at(j);
                    if (!next.skip()) {
                        newExtraSpace = next.pos - previous.pos - pick(line.o, previous.sizeHint());
                        previous.resize(line.o, next.pos - previous.pos);
                        break;
                    }
                }
                break;
            }
        }

        if (other) {
            QToolBarAreaLayoutInfo &info = other->docks[path.at(0)];
            QToolBarAreaLayoutLine &line = info.lines[path.at(1)];
            for (int i = path.at(2) - 1; i >= 0; --i) {
                QToolBarAreaLayoutItem &previous = line.toolBarItems[i];
                if (!previous.skip()) {
                    previous.resize(line.o, pick(line.o, previous.sizeHint()) + newExtraSpace);
                    break;
                }
            }

        }
    }

    Q_ASSERT(!item->gap);
    item->gap = true;
    return item->widgetItem;
}